

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

void __thiscall Assimp::Importer::GetMemoryRequirements(Importer *this,aiMemoryInfo *in)

{
  aiScene *paVar1;
  aiTexture *paVar2;
  aiAnimation *paVar3;
  aiNodeAnim *paVar4;
  aiMaterial *paVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  aiMesh *paVar10;
  uint a;
  long lVar11;
  ulong uVar12;
  
  in->animations = 0;
  in->cameras = 0;
  in->lights = 0;
  in->total = 0;
  in->textures = 0;
  in->materials = 0;
  in->meshes = 0;
  in->nodes = 0;
  paVar1 = this->pimpl->mScene;
  if (paVar1 != (aiScene *)0x0) {
    in->total = 0x80;
    if (paVar1->mNumMeshes == 0) {
      uVar9 = in->meshes;
    }
    else {
      uVar9 = in->meshes;
      uVar8 = 0;
      do {
        uVar9 = uVar9 + 0x520;
        in->meshes = uVar9;
        paVar10 = paVar1->mMeshes[uVar8];
        uVar7 = paVar10->mNumVertices;
        if (uVar7 != 0 && paVar10->mVertices != (aiVector3D *)0x0) {
          uVar9 = uVar9 + uVar7 * 0xc;
          in->meshes = uVar9;
          paVar10 = paVar1->mMeshes[uVar8];
          uVar7 = paVar10->mNumVertices;
        }
        if ((paVar10->mNormals != (aiVector3D *)0x0) && (uVar7 != 0)) {
          uVar9 = uVar9 + uVar7 * 0xc;
          in->meshes = uVar9;
          paVar10 = paVar1->mMeshes[uVar8];
        }
        if (((paVar10->mTangents != (aiVector3D *)0x0) &&
            (paVar10->mBitangents != (aiVector3D *)0x0)) && (paVar10->mNumVertices != 0)) {
          uVar9 = uVar9 + paVar10->mNumVertices * 0x18;
          in->meshes = uVar9;
        }
        lVar11 = 0;
        do {
          if ((paVar1->mMeshes[uVar8]->mColors[lVar11] == (aiColor4D *)0x0) ||
             (uVar7 = paVar1->mMeshes[uVar8]->mNumVertices, uVar7 == 0)) break;
          uVar9 = uVar9 + uVar7 * 0x10;
          in->meshes = uVar9;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        lVar11 = 0;
        do {
          paVar10 = paVar1->mMeshes[uVar8];
          if ((paVar10->mTextureCoords[lVar11] == (aiVector3D *)0x0) || (paVar10->mNumVertices == 0)
             ) goto LAB_0033c66f;
          uVar9 = uVar9 + paVar10->mNumVertices * 0xc;
          in->meshes = uVar9;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 8);
        paVar10 = paVar1->mMeshes[uVar8];
LAB_0033c66f:
        if (paVar10->mNumBones != 0 && paVar10->mBones != (aiBone **)0x0) {
          uVar9 = uVar9 + paVar10->mNumBones * 8;
          in->meshes = uVar9;
          paVar10 = paVar1->mMeshes[uVar8];
          if (paVar10->mNumBones != 0) {
            uVar12 = 0;
            do {
              in->meshes = uVar9 + 0x450;
              uVar9 = uVar9 + paVar1->mMeshes[uVar8]->mBones[uVar12]->mNumWeights * 8 + 0x450;
              in->meshes = uVar9;
              uVar12 = uVar12 + 1;
              paVar10 = paVar1->mMeshes[uVar8];
            } while (uVar12 < paVar10->mNumBones);
          }
        }
        uVar9 = paVar10->mNumFaces * 0x1c + uVar9;
        in->meshes = uVar9;
        uVar8 = uVar8 + 1;
      } while (uVar8 < paVar1->mNumMeshes);
    }
    in->total = uVar9 + 0x80;
    uVar7 = in->textures;
    if (paVar1->mNumTextures != 0) {
      uVar8 = 0;
      do {
        paVar2 = paVar1->mTextures[uVar8];
        in->textures = uVar7 + 0x428;
        if (paVar2->mHeight == 0) {
          uVar6 = paVar2->mWidth;
        }
        else {
          uVar6 = paVar2->mHeight * paVar2->mWidth * 4;
        }
        uVar7 = uVar6 + uVar7 + 0x428;
        in->textures = uVar7;
        uVar8 = uVar8 + 1;
      } while (uVar8 < paVar1->mNumTextures);
    }
    uVar7 = uVar7 + uVar9 + 0x80;
    in->total = uVar7;
    if (paVar1->mNumAnimations == 0) {
      uVar9 = in->animations;
    }
    else {
      uVar9 = in->animations;
      uVar8 = 0;
      do {
        paVar3 = paVar1->mAnimations[uVar8];
        uVar9 = uVar9 + 0x448;
        in->animations = uVar9;
        if (paVar3->mNumChannels != 0) {
          uVar6 = 0;
          do {
            paVar4 = paVar3->mChannels[uVar8];
            in->animations = uVar9 + 0x438;
            uVar9 = uVar9 + 0x438 + paVar4->mNumPositionKeys * 0x18;
            in->animations = uVar9;
            uVar9 = uVar9 + paVar4->mNumScalingKeys * 0x18;
            in->animations = uVar9;
            uVar9 = uVar9 + paVar4->mNumRotationKeys * 0x18;
            in->animations = uVar9;
            uVar6 = uVar6 + 1;
          } while (uVar6 < paVar3->mNumChannels);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < paVar1->mNumAnimations);
    }
    uVar9 = uVar9 + uVar7;
    in->total = uVar9;
    uVar7 = paVar1->mNumCameras * 0x438;
    in->cameras = uVar7;
    uVar9 = uVar9 + uVar7;
    in->total = uVar9;
    uVar7 = paVar1->mNumLights * 0x46c;
    in->lights = uVar7;
    in->total = uVar9 + uVar7;
    AddNodeWeight(&in->nodes,paVar1->mRootNode);
    uVar9 = in->total + in->nodes;
    in->total = uVar9;
    if (paVar1->mNumMaterials == 0) {
      uVar7 = in->materials;
    }
    else {
      uVar7 = in->materials;
      uVar8 = 0;
      do {
        paVar5 = paVar1->mMaterials[uVar8];
        in->materials = uVar7 + 0x10;
        uVar7 = uVar7 + paVar5->mNumAllocated * 8 + 0x10;
        in->materials = uVar7;
        if (paVar5->mNumProperties != 0) {
          uVar12 = 0;
          do {
            uVar7 = uVar7 + paVar5->mProperties[uVar12]->mDataLength;
            in->materials = uVar7;
            uVar12 = uVar12 + 1;
          } while (uVar12 < paVar5->mNumProperties);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < paVar1->mNumMaterials);
    }
    in->total = uVar7 + uVar9;
  }
  return;
}

Assistant:

void Importer::GetMemoryRequirements(aiMemoryInfo& in) const
{
    in = aiMemoryInfo();
    aiScene* mScene = pimpl->mScene;

    // return if we have no scene loaded
    if (!pimpl->mScene)
        return;


    in.total = sizeof(aiScene);

    // add all meshes
    for (unsigned int i = 0; i < mScene->mNumMeshes;++i)
    {
        in.meshes += sizeof(aiMesh);
        if (mScene->mMeshes[i]->HasPositions()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
        }

        if (mScene->mMeshes[i]->HasNormals()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
        }

        if (mScene->mMeshes[i]->HasTangentsAndBitangents()) {
            in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices * 2;
        }

        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS;++a) {
            if (mScene->mMeshes[i]->HasVertexColors(a)) {
                in.meshes += sizeof(aiColor4D) * mScene->mMeshes[i]->mNumVertices;
            }
            else break;
        }
        for (unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS;++a) {
            if (mScene->mMeshes[i]->HasTextureCoords(a)) {
                in.meshes += sizeof(aiVector3D) * mScene->mMeshes[i]->mNumVertices;
            }
            else break;
        }
        if (mScene->mMeshes[i]->HasBones()) {
            in.meshes += sizeof(void*) * mScene->mMeshes[i]->mNumBones;
            for (unsigned int p = 0; p < mScene->mMeshes[i]->mNumBones;++p) {
                in.meshes += sizeof(aiBone);
                in.meshes += mScene->mMeshes[i]->mBones[p]->mNumWeights * sizeof(aiVertexWeight);
            }
        }
        in.meshes += (sizeof(aiFace) + 3 * sizeof(unsigned int))*mScene->mMeshes[i]->mNumFaces;
    }
    in.total += in.meshes;

    // add all embedded textures
    for (unsigned int i = 0; i < mScene->mNumTextures;++i) {
        const aiTexture* pc = mScene->mTextures[i];
        in.textures += sizeof(aiTexture);
        if (pc->mHeight) {
            in.textures += 4 * pc->mHeight * pc->mWidth;
        }
        else in.textures += pc->mWidth;
    }
    in.total += in.textures;

    // add all animations
    for (unsigned int i = 0; i < mScene->mNumAnimations;++i) {
        const aiAnimation* pc = mScene->mAnimations[i];
        in.animations += sizeof(aiAnimation);

        // add all bone anims
        for (unsigned int a = 0; a < pc->mNumChannels; ++a) {
            const aiNodeAnim* pc2 = pc->mChannels[i];
            in.animations += sizeof(aiNodeAnim);
            in.animations += pc2->mNumPositionKeys * sizeof(aiVectorKey);
            in.animations += pc2->mNumScalingKeys * sizeof(aiVectorKey);
            in.animations += pc2->mNumRotationKeys * sizeof(aiQuatKey);
        }
    }
    in.total += in.animations;

    // add all cameras and all lights
    in.total += in.cameras = sizeof(aiCamera) *  mScene->mNumCameras;
    in.total += in.lights  = sizeof(aiLight)  *  mScene->mNumLights;

    // add all nodes
    AddNodeWeight(in.nodes,mScene->mRootNode);
    in.total += in.nodes;

    // add all materials
    for (unsigned int i = 0; i < mScene->mNumMaterials;++i) {
        const aiMaterial* pc = mScene->mMaterials[i];
        in.materials += sizeof(aiMaterial);
        in.materials += pc->mNumAllocated * sizeof(void*);

        for (unsigned int a = 0; a < pc->mNumProperties;++a) {
            in.materials += pc->mProperties[a]->mDataLength;
        }
    }
    in.total += in.materials;
}